

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::lts_20240722::Cord::RemovePrefix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  char *pcVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  CordRep *pCVar6;
  long lVar7;
  ulong extraout_RAX;
  ulong uVar8;
  CordRep *pCVar9;
  size_t sVar10;
  CordRep *old;
  CordRep *pCVar11;
  CordzUpdateScope scope;
  string death_message;
  undefined1 local_130 [32];
  AlphaNum local_110;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  AlphaNum local_c0;
  AlphaNum local_90;
  long local_60;
  char *local_58;
  char local_50 [32];
  
  bVar4 = (this->contents_).data_.rep_.field_0.data[0];
  uVar5 = (ulong)(char)bVar4;
  if ((uVar5 & 1) == 0) {
    uVar8 = uVar5 >> 1;
  }
  else {
    uVar8 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar8 < n) {
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Check n <= size() failed: ","");
    local_c0.piece_._M_len = 0x16;
    local_c0.piece_._M_str = "Requested prefix size ";
    pcVar2 = local_110.digits_;
    lVar7 = absl::lts_20240722::numbers_internal::FastIntToBuffer(n,pcVar2);
    local_110.piece_._M_len = lVar7 - (long)pcVar2;
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    uVar5 = (ulong)(this->contents_).data_.rep_.field_0.data[0];
    if ((uVar5 & 1) == 0) {
      sVar10 = uVar5 >> 1;
    }
    else {
      sVar10 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    local_110.piece_._M_str = pcVar2;
    local_60 = absl::lts_20240722::numbers_internal::FastIntToBuffer(sVar10,local_50);
    local_60 = local_60 - (long)local_50;
    local_58 = local_50;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_130,&local_c0,&local_110,&local_90);
    std::__cxx11::string::_M_append((char *)local_e0,local_130._0_8_);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
    (*raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
               ,0x2a6,local_e0);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2a6,"void absl::Cord::RemovePrefix(size_t)");
  }
  pCVar6 = (this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((pCVar6 != (CordRep *)0x0 && (bVar4 & 1) != 0) && (pCVar6->length == 0)) {
    RemovePrefix();
LAB_0010c273:
    InlineRep::remove_prefix(&this->contents_,n);
    return;
  }
  if (pCVar6 == (CordRep *)0x0 || (uVar5 & 1) == 0) goto LAB_0010c273;
  local_110.piece_._M_len = (size_t)cord_internal::InlineData::cordz_info((InlineData *)this);
  if ((CordzInfo *)local_110.piece_._M_len != (CordzInfo *)0x0) {
    absl::lts_20240722::cord_internal::CordzInfo::Lock((MethodIdentifier)local_110.piece_._M_len);
  }
  pCVar11 = pCVar6;
  if ((pCVar6->tag == '\x02') &&
     (RemovePrefix(), pCVar11 = (CordRep *)local_c0.piece_._M_len, (extraout_RAX & 1) == 0)) {
    LOCK();
    (((RefcountAndFlags *)(local_c0.piece_._M_len + 8))->count_).super___atomic_base<int>._M_i =
         (((RefcountAndFlags *)(local_c0.piece_._M_len + 8))->count_).super___atomic_base<int>._M_i
         + 2;
    UNLOCK();
    cord_internal::CordRep::Unref(pCVar6);
  }
  uVar5 = pCVar11->length;
  if (n < uVar5) {
    pCVar6 = pCVar11;
    if (pCVar11->tag == '\x01') {
      if ((pCVar11->refcount).count_.super___atomic_base<int>._M_i == 2) {
        if (pCVar11->tag != '\x01') {
          __assert_fail("IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x35a,"CordRepSubstring *absl::cord_internal::CordRep::substring()");
        }
        pCVar11[1].length = pCVar11[1].length + n;
        pCVar11->length = pCVar11->length - n;
        goto LAB_0010c3f8;
      }
      uVar5 = pCVar11->length;
    }
    else if (pCVar11->tag == '\x03') {
      pCVar6 = (CordRep *)absl::lts_20240722::cord_internal::CordRepBtree::SubTree((ulong)pCVar11,n)
      ;
      LOCK();
      pRVar1 = &pCVar11->refcount;
      uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + -2;
      UNLOCK();
      if ((uVar3 & 1) == 0 && (int)uVar3 < 1) goto LAB_0010c614;
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar11);
      }
      goto LAB_0010c3f8;
    }
    sVar10 = uVar5 - n;
    if (sVar10 == 0) {
      __assert_fail("n != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a2,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (uVar5 < n || sVar10 == 0) {
      __assert_fail("pos < rep->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a3,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (n == 0) {
      LOCK();
      (pCVar11->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar11->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    else {
      pCVar9 = pCVar11;
      if (pCVar11->tag == '\x01') {
        n = n + pCVar11[1].length;
        pCVar9 = *(CordRep **)&pCVar11[1].refcount;
      }
      pCVar6 = (CordRep *)operator_new(0x20);
      pCVar6->length = 0;
      pCVar6->refcount = (atomic<int>)0x0;
      pCVar6->tag = '\0';
      pCVar6->storage[0] = '\0';
      pCVar6->storage[1] = '\0';
      pCVar6->storage[2] = '\0';
      (pCVar6->refcount).count_.super___atomic_base<int>._M_i = 2;
      pCVar6->length = sVar10;
      pCVar6->tag = '\x01';
      pCVar6[1].length = n;
      if (pCVar9 == (CordRep *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      (pCVar9->refcount).count_.super___atomic_base<int>._M_i =
           (pCVar9->refcount).count_.super___atomic_base<int>._M_i + 2;
      UNLOCK();
      *(CordRep **)&pCVar6[1].refcount = pCVar9;
    }
    LOCK();
    pRVar1 = &pCVar11->refcount;
    uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) != 0 || 0 < (int)uVar3) {
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar11);
      }
LAB_0010c3f8:
      sVar10 = local_110.piece_._M_len;
      if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
        __assert_fail("data_.is_tree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                      ,0x508,
                      "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                     );
      }
      if (pCVar6 == (CordRep *)0x0) {
        (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
        (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      }
      else {
        (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar6;
      }
      if ((CordzInfo *)local_110.piece_._M_len != (CordzInfo *)0x0) {
        absl::lts_20240722::Mutex::AssertHeld();
        *(CordRep **)(sVar10 + 0x40) = pCVar6;
      }
      cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&local_110);
      return;
    }
  }
  else {
    LOCK();
    pRVar1 = &pCVar11->refcount;
    uVar3 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar3 & 1) != 0 || 0 < (int)uVar3) {
      if (uVar3 == 2) {
        absl::lts_20240722::cord_internal::CordRep::Destroy(pCVar11);
      }
      pCVar6 = (CordRep *)0x0;
      goto LAB_0010c3f8;
    }
  }
LAB_0010c614:
  __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
}

Assistant:

void Cord::RemovePrefix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested prefix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.remove_prefix(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemovePrefix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      CordRep* old = tree;
      tree = tree->btree()->SubTree(n, tree->length - n);
      CordRep::Unref(old);
    } else if (tree->IsSubstring() && tree->refcount.IsOne()) {
      tree->substring()->start += n;
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, n, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}